

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborarray.cpp
# Opt level: O0

void __thiscall QCborArray::insert(QCborArray *this,qsizetype i,QCborValue *value)

{
  QCborArray *this_00;
  qsizetype in_RDX;
  QCborContainerPrivate *in_RSI;
  QCborValue *in_RDI;
  qsizetype unaff_retaddr;
  QCborContainerPrivate *in_stack_00000008;
  QCborContainerPrivate *in_stack_ffffffffffffffd8;
  ContainerDisposition disp;
  QCborValue *value_00;
  
  if ((long)in_RSI < 0) {
    this_00 = (QCborArray *)size((QCborArray *)in_RDI);
    detach(this_00,in_RDX);
    disp = (ContainerDisposition)((ulong)this_00 >> 0x20);
    value_00 = in_RDI;
  }
  else {
    value_00 = in_RDI;
    QExplicitlySharedDataPointer<QCborContainerPrivate>::data
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x475eb7);
    QCborContainerPrivate::grow(in_RSI,in_RDX);
    disp = (ContainerDisposition)((ulong)in_RSI >> 0x20);
    QExplicitlySharedDataPointer<QCborContainerPrivate>::operator=
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)in_RDI,
               in_stack_ffffffffffffffd8);
  }
  QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
            ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x475edb);
  QCborContainerPrivate::insertAt(in_stack_00000008,unaff_retaddr,value_00,disp);
  return;
}

Assistant:

void QCborArray::insert(qsizetype i, const QCborValue &value)
{
    if (i < 0) {
        Q_ASSERT(i == -1);
        i = size();
        detach(i + 1);
    } else {
        d = QCborContainerPrivate::grow(d.data(), i); // detaches
    }
    d->insertAt(i, value);
}